

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::action(NaPNDelay *this)

{
  uint uVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  NaReal *pNVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  NaPetriNode *in_RDI;
  uint j;
  uint i;
  uint nSize;
  NaReal in_stack_ffffffffffffffc8;
  NaVector *in_stack_ffffffffffffffd0;
  NaPetriCnInput *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
  uVar1 = (*pNVar3->_vptr_NaVector[6])();
  NaVector::shift((NaVector *)CONCAT44(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  for (uVar5 = 0; uVar7 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20), uVar5 < uVar1;
      uVar5 = uVar5 + 1) {
    pNVar3 = NaPetriCnInput::data(in_stack_ffffffffffffffd8);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,(ulong)uVar5);
    in_stack_ffffffffffffffd8 = *(NaPetriCnInput **)CONCAT44(extraout_var,iVar2);
    pNVar4 = NaVector::operator[](in_stack_ffffffffffffffd0,uVar7);
    *pNVar4 = (NaReal)in_stack_ffffffffffffffd8;
  }
  if (((((ulong)in_RDI[5].pcaPorts.pTail & 0x10000000000) != 0) &&
      (((ulong)in_RDI[5].pcaPorts.pTail & 0x1000000000000) != 0)) &&
     (uVar5 = NaPetriNode::activations(in_RDI), uVar5 == 0)) {
    for (uVar5 = 1; uVar5 <= *(uint *)&in_RDI[5].pcaPorts.pHead; uVar5 = uVar5 + 1) {
      for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
        pNVar4 = NaVector::operator[](in_stack_ffffffffffffffd0,uVar7);
        in_stack_ffffffffffffffd0 = (NaVector *)*pNVar4;
        pNVar4 = NaVector::operator[](in_stack_ffffffffffffffd0,uVar7);
        *pNVar4 = (NaReal)in_stack_ffffffffffffffd0;
      }
    }
  }
  for (uVar5 = 0; uVar5 < *(uint *)&in_RDI[6].pcaPorts._vptr_NaDynAr; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      pNVar4 = NaVector::operator[]
                         (in_stack_ffffffffffffffd0,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                         );
      in_stack_ffffffffffffffc8 = *pNVar4;
      pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 2));
      iVar2 = (*pNVar3->_vptr_NaVector[8])();
      *(NaReal *)CONCAT44(extraout_var_00,iVar2) = in_stack_ffffffffffffffc8;
    }
  }
  if (((ulong)in_RDI[5].pcaPorts.pTail & 0x100000000) == 0) {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var_02,iVar2) = 0xbff0000000000000;
  }
  else {
    pNVar3 = NaPetriCnOutput::data((NaPetriCnOutput *)&in_RDI[3].bHalt);
    iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
    *(undefined8 *)CONCAT44(extraout_var_01,iVar2) = 0x3ff0000000000000;
  }
  return;
}

Assistant:

void
NaPNDelay::action ()
{
    // Portion size
    unsigned	nSize = in.data().dim();

    // Make free space in buffer area
    vBuffer.shift(nSize);

    // Copy input data to buffer
    unsigned    i, j;
    for(i = 0; i < nSize; ++i)
      {
        vBuffer[i] = in.data()[i];
      }

    // If 1st input should be used for all delays
    if(bSleepValue && bSleepValue1st && 0 == activations()) {
	for(j = 1; j <= nMaxLag; ++j)
	    for(i = 0; i < nSize; ++i)
		vBuffer[i + nSize * j] = vBuffer[i];
    }

    // Copy selected portions of stored data to output
    for(j = 0; j < nOutDim; ++j)
      for(i = 0; i < nSize; ++i)
	{
	  dout.data()[j * nSize + i] = vBuffer[piOutMap[j] * nSize + i];
	}

    // Sleep/awaken related nodes
    if(bAwaken){
        sync.data()[0] = 1.0;   // Let linked nodes to deliver data
    }else{
        sync.data()[0] = -1.0;  // Force to be passive linked nodes
    }
}